

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O0

int main(void)

{
  char c_1;
  exception *e;
  char c;
  allocator<char> local_31;
  string local_30;
  undefined4 local_c;
  
  local_c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"k",&local_31);
  Symbol_table::define_name(&st,&local_30,1000.0,false);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  calculate();
  return 0;
}

Assistant:

int main()
{
	st.define_name("k", 1000);
	try
	{
		calculate();
		return 0;
	}
	catch (exception& e)
	{
		cerr << "exception: " << e.what() << endl;
		char c;
		while (cin >> c && c != ';');
		return 1;
	}
	catch (...)
	{
		cerr << "exception\n";
		char c;
		while (cin >> c && c != ';');
		return 2;
	}
}